

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteQuotedData(WatWriter *this,void *data,size_t length)

{
  byte bVar1;
  undefined8 in_RAX;
  Stream *this_00;
  size_t sVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  WriteNextChar(this);
  uStack_38._0_7_ = CONCAT16(0x22,(undefined6)uStack_38);
  Stream::WriteData(this->stream_,(void *)((long)&uStack_38 + 6),1,(char *)0x0,No);
  if (length != 0) {
    sVar2 = 0;
    do {
      bVar1 = *(byte *)((long)data + sVar2);
      this_00 = this->stream_;
      if ((anonymous_namespace)::s_is_char_escaped[bVar1] != '\0') {
        uStack_38._0_6_ = CONCAT15(0x5c,(undefined5)uStack_38);
        Stream::WriteData(this_00,(void *)((long)&uStack_38 + 5),1,(char *)0x0,No);
        Stream::WriteU8(this->stream_,(uint)(byte)"0123456789abcdef"[bVar1 >> 4],(char *)0x0,No);
        bVar1 = "0123456789abcdef"[bVar1 & 0xf];
        this_00 = this->stream_;
      }
      Stream::WriteU8(this_00,(uint)bVar1,(char *)0x0,No);
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
  Stream::WriteData(this->stream_,(void *)((long)&uStack_38 + 7),1,(char *)0x0,No);
  this->next_char_ = Space;
  return;
}

Assistant:

void WatWriter::WriteQuotedData(const void* data, size_t length) {
  const uint8_t* u8_data = static_cast<const uint8_t*>(data);
  static const char s_hexdigits[] = "0123456789abcdef";
  WriteNextChar();
  WritePutc('\"');
  for (size_t i = 0; i < length; ++i) {
    uint8_t c = u8_data[i];
    if (s_is_char_escaped[c]) {
      WritePutc('\\');
      WritePutc(s_hexdigits[c >> 4]);
      WritePutc(s_hexdigits[c & 0xf]);
    } else {
      WritePutc(c);
    }
  }
  WritePutc('\"');
  next_char_ = NextChar::Space;
}